

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

int __thiscall Parse::argList(Parse *this)

{
  DelimiterTable *pDVar1;
  int iVar2;
  reference pvVar3;
  mapped_type *pmVar4;
  ostream *poVar5;
  reference pbVar6;
  bool bVar7;
  undefined1 local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> val;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  allocator local_39;
  key_type local_38;
  Parse *local_18;
  Parse *this_local;
  
  local_18 = this;
  iVar2 = expression(this);
  if (iVar2 == 0) {
    this_local._4_4_ = 0;
  }
  else {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->paramCall
               ,&this->expName);
    pvVar3 = std::vector<Token,_std::allocator<Token>_>::operator[]
                       (this->tokenVec,(long)this->curIndex);
    bVar7 = false;
    if (pvVar3->type == DELIMTER) {
      pDVar1 = this->delimiterTable;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_38,",",&local_39);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&(pDVar1->
                             super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ).index,&local_38);
      iVar2 = *pmVar4;
      pvVar3 = std::vector<Token,_std::allocator<Token>_>::operator[]
                         (this->tokenVec,(long)this->curIndex);
      bVar7 = iVar2 == pvVar3->id;
      std::__cxx11::string::~string((string *)&local_38);
      std::allocator<char>::~allocator((allocator<char> *)&local_39);
    }
    if (bVar7) {
      this->curIndex = this->curIndex + 1;
      iVar2 = argList(this);
      if (iVar2 == 0) {
        poVar5 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_21c78);
        pvVar3 = std::vector<Token,_std::allocator<Token>_>::operator[]
                           (this->tokenVec,(long)this->curIndex);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,pvVar3->line);
        poVar5 = std::operator<<(poVar5,anon_var_dwarf_217a0);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        exit(0);
      }
    }
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->paramCall);
    val.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->paramCall);
    while (bVar7 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)((long)&val.field_2 + 8)), bVar7) {
      pbVar6 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end2);
      std::__cxx11::string::string((string *)local_88,(string *)pbVar6);
      std::vector<QuadTuple,std::allocator<QuadTuple>>::
      emplace_back<char_const(&)[8],std::__cxx11::string&,char_const(&)[3],char_const(&)[3]>
                ((vector<QuadTuple,std::allocator<QuadTuple>> *)this->quadVec,
                 (char (*) [8])"paramin",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                 (char (*) [3])"__",(char (*) [3])"__");
      std::__cxx11::string::~string((string *)local_88);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&this->paramCall);
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int Parse::argList() {
    if(expression())  {
        paramCall.emplace_back(expName);
        if(tokenVec[curIndex].type == DELIMTER && delimiterTable.index[","] == tokenVec[curIndex].id) {
            curIndex++;
            if (!argList()) {
                cout << ",后没有参数定义在第" << tokenVec[curIndex].line << "行" << endl;
                exit(0);
            }
        }
        for(auto val : paramCall) {
            quadVec.emplace_back("paramin", val, "__", "__");
        }
        paramCall.clear();
        return 1;
    }
    return 0;
}